

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O3

void canonical_single_run<double,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
               (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *generator,
               size_t times)

{
  double dVar1;
  double dVar2;
  
  if (times != 0) {
    dVar2 = 0.0;
    do {
      dVar1 = std::
              generate_canonical<double,8ul,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
                        (generator);
      times = times - 1;
      dVar2 = dVar2 + dVar1;
    } while (times != 0);
    if (dVar2 != 0.0) {
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"This is to avoid compiler optimizations.",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  return;
}

Assistant:

void canonical_single_run (G& generator, size_t times ) {
    Real total = 0.0;

    for ( size_t i = 0; i < times; ++i )
        total += generate_canonical<Real, sizeof(Real)>(generator);

    if ( total == 0 ) cout << "This is to avoid compiler optimizations." << endl;
}